

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O0

QPromise<QList<int>_>
QtPromise::filter<QList<int>,tst_qpromise_filter::delayedRejected()::__0>
          (QPromiseBase<QList<bool>> *values,QList<int> *param_2)

{
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_> extraout_RDX;
  QPromise<QList<int>_> QVar1;
  QList<int> local_50;
  anon_class_24_1_70098e60 local_30;
  QList<int> *values_local;
  QPromiseBase<QList<bool>> *local_10;
  
  local_30.values.d.size = (qsizetype)param_2;
  local_10 = values;
  map<QList<int>,tst_qpromise_filter::delayedRejected()::__0>(&local_30,param_2);
  QList<int>::QList(&local_50,(QList<int> *)local_30.values.d.size);
  QPromiseBase<QList<bool>>::
  then<QtPromise::filter<QList<int>,tst_qpromise_filter::delayedRejected()::__0>(QList<int>const&,tst_qpromise_filter::delayedRejected()::__0)::_lambda(QList<bool>const&)_1_>
            (values,&local_30);
  filter<QList<int>,tst_qpromise_filter::delayedRejected()::$_0>(QList<int>const&,tst_qpromise_filter::delayedRejected()::$_0)
  ::{lambda(QList<bool>const&)#1}::~QPromise((_lambda_QList<bool>const___1_ *)&local_50);
  QPromise<QList<bool>_>::~QPromise((QPromise<QList<bool>_> *)&local_30);
  QVar1.super_QPromiseBase<QList<int>_>.m_d.d = extraout_RDX.d;
  QVar1.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)values;
  return (QPromise<QList<int>_>)QVar1.super_QPromiseBase<QList<int>_>;
}

Assistant:

static inline QPromise<Sequence> filter(const Sequence& values, Functor fn)
{
    return QtPromise::map(values, fn).then([=](const QVector<bool>& filters) {
        Sequence filtered;

        auto filter = filters.begin();
        for (auto& value : values) {
            if (*filter) {
                filtered.push_back(std::move(value));
            }

            filter++;
        }

        return filtered;
    });
}